

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_43984::MockTest::RunImpl(MockTest *this,TestResults *testResults_)

{
  int iVar1;
  
  if (0 < *(int *)&(this->super_Test).field_0x34) {
    iVar1 = 0;
    do {
      if ((this->super_Test).field_0x32 == '\x01') {
        UnitTest::ReportAssert("desc","file",0);
      }
      else if ((this->super_Test).field_0x31 == '\0') {
        UnitTest::TestResults::OnTestFailure(testResults_,&(this->super_Test).m_details,"message");
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < *(int *)&(this->super_Test).field_0x34);
  }
  return;
}

Assistant:

virtual void RunImpl(TestResults& testResults_) const
    {
        for (int i=0; i < count; ++i)
        {
            if (asserted)
                ReportAssert("desc", "file", 0);
            else if (!success)
                testResults_.OnTestFailure(m_details, "message");
        }
    }